

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_str.c
# Opt level: O1

uchar * ares_memmem(uchar *big,size_t big_len,uchar *little,size_t little_len)

{
  uchar *puVar1;
  
  if ((((little_len != 0) && (big_len != 0)) && (big != (uchar *)0x0)) && (little != (uchar *)0x0))
  {
    puVar1 = (uchar *)memmem(big,big_len,little,little_len);
    return puVar1;
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *ares_memmem(const unsigned char *big, size_t big_len,
                           const unsigned char *little, size_t little_len)
{
  unsigned char *ptr;

  if (big == NULL || little == NULL || big_len == 0 || little_len == 0) {
    return NULL;
  }

#ifdef HAVE_MEMMEM
  ptr = memmem(big, big_len, little, little_len);
  return ptr;
#else
  while (1) {
    ptr = memchr(big, little[0], big_len);
    if (ptr == NULL) {
      break;
    }

    big_len -= (size_t)(ptr - big);
    big      = ptr;
    if (big_len < little_len) {
      break;
    }

    if (memcmp(big, little, little_len) == 0) {
      return ptr;
    }

    big++;
    big_len--;
  }

  return NULL;
#endif
}